

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::Object::stAt(InterpreterProxy *interpreter)

{
  int iVar1;
  Oop *oopData;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  SmallIntegerValue SVar2;
  SmallIntegerValue SVar3;
  undefined4 extraout_var_04;
  void *pvVar4;
  ulong uVar5;
  Oop OVar6;
  uint uVar7;
  long lVar8;
  Oop self;
  Oop indexOop;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  anon_union_8_4_0eb573b0_for_Oop_0 local_30;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  (*interpreter->_vptr_InterpreterProxy[1])(interpreter,CONCAT44(extraout_var_00,iVar1));
  iVar1 = stSize(interpreter);
  if (iVar1 == 0) {
    local_40._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    local_40.uintValue._4_4_ = extraout_var_01;
    local_30._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    local_30.uintValue._4_4_ = extraout_var_02;
    local_38._0_4_ = (*interpreter->_vptr_InterpreterProxy[6])(interpreter);
    local_38.uintValue._4_4_ = extraout_var_03;
    SVar2 = Oop::decodeSmallInteger((Oop *)&local_38);
    SVar3 = Oop::decodeSmallInteger((Oop *)&local_30);
    if ((SVar3 < 1) || (SVar2 < SVar3 + -1)) {
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    }
    else {
      iVar1 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
      pvVar4 = Oop::getFirstIndexableFieldPointer
                         ((Oop *)&local_40,(VMContext *)CONCAT44(extraout_var_04,iVar1));
      uVar7 = (uint)((ulong)*(undefined8 *)local_40.pointer >> 0x23) & 0x1f;
      if (uVar7 < 9) {
        lVar8 = *(long *)((long)pvVar4 + SVar3 * 8 + -8);
      }
      else {
        if (uVar7 < 0x10) {
          if (uVar7 < 0xc) {
            if (uVar7 == 9) {
              OVar6 = VMContext::positiveInt64ObjectFor
                                ((VMContext *)CONCAT44(extraout_var_04,iVar1),
                                 *(uint64_t *)((long)pvVar4 + SVar3 * 8 + -8));
              iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,OVar6.field_0);
              return iVar1;
            }
            uVar5 = (ulong)*(uint *)((long)pvVar4 + SVar3 * 4 + -4);
          }
          else {
            uVar5 = (ulong)*(ushort *)((long)pvVar4 + SVar3 * 2 + -2);
          }
        }
        else {
          uVar5 = (ulong)*(byte *)((long)pvVar4 + SVar3 + -1);
        }
        lVar8 = uVar5 * 2 + 1;
      }
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,lVar8);
    }
  }
  return iVar1;
}

Assistant:

int Object::stAt(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    interpreter->pushOop(interpreter->getReceiver());
    auto error = stSize(interpreter);
    if(error != 0)
        return error;

    Oop self = interpreter->getReceiver();
    Oop indexOop = interpreter->getTemporary(0);
    auto size = interpreter->popOop().decodeSmallInteger();
	auto index = indexOop.decodeSmallInteger() - 1;
	if(index > size || index < 0)
		return interpreter->primitiveFailed();

    // Get the element.
    auto context = interpreter->getContext();
    auto firstIndexableField = self.getFirstIndexableFieldPointer(context);
    auto format = self.header->objectFormat;
    if(format < OF_INDEXABLE_64)
    {
        auto oopData = reinterpret_cast<Oop*> (firstIndexableField);
        return interpreter->returnOop(oopData[index]);
    }

    if(format >= OF_INDEXABLE_8)
    {
        auto data = reinterpret_cast<uint8_t*> (firstIndexableField);
        return interpreter->returnOop(Oop::encodeSmallInteger(data[index]));
    }

    if(format >= OF_INDEXABLE_16)
    {
        auto data = reinterpret_cast<uint16_t*> (firstIndexableField);
        return interpreter->returnOop(Oop::encodeSmallInteger(data[index]));
    }

    if(format >= OF_INDEXABLE_32)
    {
        auto data = reinterpret_cast<uint32_t*> (firstIndexableField);
#ifdef OBJECT_MODEL_SPUR_64
        return interpreter->returnOop(Oop::encodeSmallInteger(data[index]));
#else
        return interpreter->returnOop(context->positiveInt32ObjectFor(data[index]));
#endif
    }

    if(format == OF_INDEXABLE_64)
    {
        auto data = reinterpret_cast<uint64_t*> (firstIndexableField);
        return interpreter->returnOop(context->positiveInt64ObjectFor(data[index]));
    }

    // Should not reach here.
    return interpreter->primitiveFailed();
}